

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.cpp
# Opt level: O0

void dg::pta::PointerGraph::initStaticNodes(void)

{
  undefined *puVar1;
  Offset in_stack_ffffffffffffffd0;
  PSNode *in_stack_ffffffffffffffd8;
  Offset local_18;
  Pointer local_10;
  
  PointerIdPointsToSet::clear((PointerIdPointsToSet *)0x1582da);
  PointerIdPointsToSet::clear((PointerIdPointsToSet *)0x1582f0);
  puVar1 = NULLPTR;
  Offset::Offset(&local_18,0);
  Pointer::Pointer(&local_10,(PSNode *)puVar1,local_18);
  PointerIdPointsToSet::add
            ((PointerIdPointsToSet *)in_stack_ffffffffffffffd8,
             (Pointer *)in_stack_ffffffffffffffd0.offset);
  puVar1 = UNKNOWN_MEMORY;
  Offset::Offset((Offset *)&stack0xffffffffffffffd0,Offset::UNKNOWN);
  Pointer::Pointer((Pointer *)&stack0xffffffffffffffd8,(PSNode *)puVar1,in_stack_ffffffffffffffd0);
  PointerIdPointsToSet::add
            ((PointerIdPointsToSet *)in_stack_ffffffffffffffd8,
             (Pointer *)in_stack_ffffffffffffffd0.offset);
  return;
}

Assistant:

void PointerGraph::initStaticNodes() {
    NULLPTR->pointsTo.clear();
    UNKNOWN_MEMORY->pointsTo.clear();
    NULLPTR->pointsTo.add(Pointer(NULLPTR, 0));
    UNKNOWN_MEMORY->pointsTo.add(Pointer(UNKNOWN_MEMORY, Offset::UNKNOWN));
}